

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O3

bool R_ClipWallSegment(int first,int last,bool solid)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  cliprange_t *pcVar4;
  int iVar5;
  cliprange_t *pcVar6;
  short sVar7;
  cliprange_t *pcVar8;
  
  pcVar4 = solidsegs;
  do {
    pcVar6 = pcVar4;
    pcVar4 = pcVar6 + 1;
  } while (pcVar6->last < first);
  iVar5 = (int)pcVar6->first;
  bVar3 = first < iVar5;
  if (first < iVar5) {
    sVar7 = (short)first;
    if (last <= iVar5) {
      R_StoreWallRange(first,last);
      if (!solid || ((byte)fake3D & 7) != 0) {
        return true;
      }
      if (pcVar6->first == last) {
        pcVar6->first = sVar7;
        return true;
      }
      pcVar8 = newend + 1;
      for (pcVar4 = newend; newend = pcVar8, pcVar6 != pcVar4; pcVar4 = pcVar4 + -1) {
        *pcVar4 = pcVar4[-1];
        pcVar8 = newend;
      }
      pcVar4->first = sVar7;
      pcVar4->last = (short)last;
      return true;
    }
    R_StoreWallRange(first,iVar5);
    if ((solid) && (((byte)fake3D & 7) == 0)) {
      pcVar6->first = sVar7;
    }
  }
  pcVar4 = pcVar6;
  if (pcVar6->last < last) {
    do {
      if (last < pcVar4[1].first) {
        R_StoreWallRange((int)pcVar4->last,last);
        pcVar8 = pcVar4;
        iVar5 = last;
        break;
      }
      pcVar8 = pcVar4 + 1;
      R_StoreWallRange((int)pcVar4->last,(int)pcVar4[1].first);
      iVar5 = (int)pcVar4[1].last;
      pcVar4 = pcVar8;
    } while (iVar5 < last);
    bVar3 = true;
    if ((solid && ((byte)fake3D & 7) == 0) && (pcVar6->last = (short)iVar5, pcVar6 != pcVar8)) {
      uVar1 = (ulong)((long)newend - (long)pcVar8) >> 2;
      iVar5 = (int)uVar1;
      if (iVar5 < 1) {
        uVar1 = 1;
      }
      else {
        uVar2 = 0;
        do {
          (pcVar6 + 1)[uVar2] = pcVar8[uVar2 + 1];
          uVar2 = uVar2 + 1;
        } while ((uVar1 & 0xffffffff) != uVar2);
        uVar1 = (ulong)(iVar5 + 1);
      }
      newend = pcVar6 + uVar1;
    }
  }
  return bVar3;
}

Assistant:

bool R_ClipWallSegment (int first, int last, bool solid)
{
	cliprange_t *next, *start;
	int i, j;
	bool res = false;

	// Find the first range that touches the range
	// (adjacent pixels are touching).
	start = solidsegs;
	while (start->last < first)
		start++;

	if (first < start->first)
	{
		res = true;
		if (last <= start->first)
		{
			// Post is entirely visible (above start).
			R_StoreWallRange (first, last);
			if (fake3D & FAKE3D_FAKEMASK)
			{
				return true;
			}

			// Insert a new clippost for solid walls.
			if (solid)
			{
				if (last == start->first)
				{
					start->first = first;
				}
				else
				{
					next = newend;
					newend++;
					while (next != start)
					{
						*next = *(next-1);
						next--;
					}
					next->first = first;
					next->last = last;
				}
			}
			return true;
		}

		// There is a fragment above *start.
		R_StoreWallRange (first, start->first);

		// Adjust the clip size for solid walls
		if (solid && !(fake3D & FAKE3D_FAKEMASK))
		{
			start->first = first;
		}
	}

	// Bottom contained in start?
	if (last <= start->last)
		return res;

	next = start;
	while (last >= (next+1)->first)
	{
		// There is a fragment between two posts.
		R_StoreWallRange (next->last, (next+1)->first);
		next++;
		
		if (last <= next->last)
		{
			// Bottom is contained in next.
			last = next->last;
			goto crunch;
		}
	}

	// There is a fragment after *next.
	R_StoreWallRange (next->last, last);

crunch:
	if (fake3D & FAKE3D_FAKEMASK)
	{
		return true;
	}
	if (solid)
	{
		// Adjust the clip size.
		start->last = last;

		if (next != start)
		{
			// Remove start+1 to next from the clip list,
			// because start now covers their area.
			for (i = 1, j = (int)(newend - next); j > 0; i++, j--)
			{
				start[i] = next[i];
			}
			newend = start+i;
		}
	}
	return true;
}